

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XPMPMultiplayer.cpp
# Opt level: O1

char * XPMP2::XPMPValidateResourceFiles(char *resourceDir)

{
  bool bVar1;
  size_t sVar2;
  logLevelTy lvl;
  char *pcVar3;
  int ln;
  char *szMsg;
  char *pcVar4;
  long *local_58;
  long local_50;
  long local_48 [2];
  long *local_38 [2];
  long local_28 [2];
  
  if ((resourceDir == (char *)0x0) || (sVar2 = strlen(resourceDir), sVar2 < 5)) {
    pcVar3 = "resourceDir too short / nullptr";
    if (3 < glob) {
      return "resourceDir too short / nullptr";
    }
    pcVar4 = "<nullptr>";
    if (resourceDir != (char *)0x0) {
      pcVar4 = resourceDir;
    }
    szMsg = "Resource directory too short: %s";
    ln = 0x40;
  }
  else {
    local_58 = local_48;
    sVar2 = strlen(resourceDir);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,resourceDir,resourceDir + sVar2);
    local_38[0] = local_28;
    std::__cxx11::string::_M_construct<char*>((string *)local_38,local_58,local_50 + (long)local_58)
    ;
    std::__cxx11::string::operator=((string *)&DAT_002ef658,(string *)local_38);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
    }
    if (local_58 != local_48) {
      operator_delete(local_58,local_48[0] + 1);
    }
    if (DAT_002ef658[DAT_002ef660 + -1] == '/') {
      std::__cxx11::string::pop_back();
    }
    bVar1 = IsDir((string *)&DAT_002ef658);
    if (bVar1) {
      std::__cxx11::string::push_back('X');
      bVar1 = FindResFile("related.txt",(string *)&DAT_002ef518,true);
      if (!bVar1) {
        return "related.txt not found in resource directory";
      }
      bVar1 = FindResFile("relOp.txt",(string *)&DAT_002ef538,false);
      if ((!bVar1) && (glob < 3)) {
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/XPMPMultiplayer.cpp"
               ,0x54,"XPMPValidateResourceFiles",logWARN,
               "Optional file relOp.txt not available in resource directory");
      }
      bVar1 = FindResFile("Doc8643.txt",(string *)&DAT_002ef4c8,true);
      if (!bVar1) {
        return "Doc8643.txt not found in resource directory";
      }
      bVar1 = FindResFile("MapIcons.png",(string *)&DAT_002ef6f8,true);
      if (!bVar1) {
        return "MapIcons.png not found in resource directory";
      }
      bVar1 = FindResFile("Obj8DataRefs.txt",(string *)&DAT_002ef430,false);
      pcVar3 = "";
      if (bVar1) {
        return "";
      }
      if (DAT_002ef427 != '\x01') {
        return "";
      }
      if (2 < glob) {
        return "";
      }
      szMsg = "File \'%s\' is missing in resource directory \'%s\'";
      pcVar4 = "Obj8DataRefs.txt";
      ln = 0x5e;
      lvl = logWARN;
      goto LAB_00242267;
    }
    pcVar3 = "Resource directory unavailable";
    if (3 < glob) {
      return "Resource directory unavailable";
    }
    szMsg = "Resource directory \'%s\' does not exist!";
    ln = 0x4a;
    pcVar4 = DAT_002ef658;
  }
  lvl = logERR;
LAB_00242267:
  LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/XPMPMultiplayer.cpp"
         ,ln,"XPMPValidateResourceFiles",lvl,szMsg,pcVar4);
  return pcVar3;
}

Assistant:

const char* XPMPValidateResourceFiles (const char* resourceDir)
{
    // Store the resource dir
    if (!resourceDir || strlen(resourceDir) < 5) {
        LOG_MSG(logERR, ERR_RSRC_DIR_INVALID, resourceDir ? resourceDir : "<nullptr>");
        return "resourceDir too short / nullptr";
    }
    glob.resourceDir = TOPOSIX(resourceDir);
    
    // for path validation it must not end in the path separator
    if (glob.resourceDir.back() == PATH_DELIM_STD)
        glob.resourceDir.pop_back();    
    // Check for its existence
    if (!IsDir(glob.resourceDir)) {
        LOG_MSG(logERR, ERR_RSRC_DIR_UNAVAIL, glob.resourceDir.c_str());
        return "Resource directory unavailable";
    }
    // now add a separator to the path for ease of future use
    glob.resourceDir += PATH_DELIM_STD;
    
    // Validate and save a few files
    if (!FindResFile(RSRC_RELATED, glob.pathRelated[REL_TXT_DESIGNATOR]))
        return "related.txt not found in resource directory";
    if (!FindResFile(RSRC_REL_OP, glob.pathRelated[REL_TXT_OP], false)) {
        LOG_MSG(logWARN, "Optional file relOp.txt not available in resource directory");
    }
    if (!FindResFile(RSRC_DOC8643, glob.pathDoc8643))
        return "Doc8643.txt not found in resource directory";
    if (!FindResFile(RSRC_MAP_ICONS, glob.pathMapIcons))
        return "MapIcons.png not found in resource directory";
    // this last one is not essentially required:
    if (!FindResFile(RSRC_OBJ8DATAREFS, glob.pathObj8DataRefs, false) &&
        glob.bObjReplDataRefs) {
        LOG_MSG(logWARN, ERR_RSRC_FILE_UNAVAIL,
                RSRC_OBJ8DATAREFS, glob.resourceDir.c_str());

    }
    
    // Success
    return "";
}